

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_line(p_ply ply)

{
  int iVar1;
  p_ply ptVar2;
  p_ply in_RDI;
  char *end;
  int local_4;
  
  ptVar2 = (p_ply)strchr(in_RDI->buffer + in_RDI->buffer_first,10);
  if (ptVar2 == (p_ply)0x0) {
    ptVar2 = (p_ply)((long)in_RDI + (in_RDI->buffer_last - in_RDI->buffer_first) + 0x4c);
    iVar1 = BREFILL(ptVar2);
    if (iVar1 == 0) {
      ply_ferror(in_RDI,"Unexpected end of file");
      local_4 = 0;
    }
    else {
      ptVar2 = (p_ply)strchr((char *)ptVar2,10);
      if (ptVar2 == (p_ply)0x0) {
        ply_ferror(in_RDI,"Token too large");
        local_4 = 0;
      }
      else {
        in_RDI->buffer_token = in_RDI->buffer_first;
        in_RDI->buffer_first =
             (long)ptVar2 + (in_RDI->buffer_first - (long)(in_RDI->buffer + in_RDI->buffer_first));
        in_RDI->buffer[in_RDI->buffer_first] = '\0';
        in_RDI->buffer_first = in_RDI->buffer_first + 1;
        local_4 = ply_check_line(ptVar2);
      }
    }
  }
  else {
    in_RDI->buffer_token = in_RDI->buffer_first;
    in_RDI->buffer_first =
         (long)ptVar2 + (in_RDI->buffer_first - (long)(in_RDI->buffer + in_RDI->buffer_first));
    in_RDI->buffer[in_RDI->buffer_first] = '\0';
    in_RDI->buffer_first = in_RDI->buffer_first + 1;
    local_4 = ply_check_line(ptVar2);
  }
  return local_4;
}

Assistant:

static int ply_read_line(p_ply ply) {
    const char *end = NULL;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    /* look for a end of line */
    end = strchr(BFIRST(ply), '\n');
    /* if we didn't reach the end of the buffer, we are done */
    if (end) {
        ply->buffer_token = ply->buffer_first;
        BSKIP(ply, end - BFIRST(ply));
        *BFIRST(ply) = '\0';
        BSKIP(ply, 1);
        return ply_check_line(ply);
    } else {
        end = ply->buffer + BSIZE(ply);
        /* otherwise, try to refill buffer */
        if (!BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
    }
    /* keep looking from where we left */
    end = strchr(end, '\n');
    /* check if the token is too large for our buffer */
    if (!end) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply->buffer_token = ply->buffer_first;
    BSKIP(ply, end - BFIRST(ply));
    *BFIRST(ply) = '\0';
    BSKIP(ply, 1);
    return ply_check_line(ply);
}